

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O3

uint LDSketch_find(LDSketch_t *tbl,uchar *key,int start_bit,int end_bit,int row_no)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  uchar key_str [50];
  
  key_str[0x20] = '\0';
  key_str[0x21] = '\0';
  key_str[0x22] = '\0';
  key_str[0x23] = '\0';
  key_str[0x24] = '\0';
  key_str[0x25] = '\0';
  key_str[0x26] = '\0';
  key_str[0x27] = '\0';
  key_str[0x28] = '\0';
  key_str[0x29] = '\0';
  key_str[0x2a] = '\0';
  key_str[0x2b] = '\0';
  key_str[0x2c] = '\0';
  key_str[0x2d] = '\0';
  key_str[0x2e] = '\0';
  key_str[0x2f] = '\0';
  key_str[0x30] = '\0';
  key_str[0x31] = '\0';
  key_str[0] = '\0';
  key_str[1] = '\0';
  key_str[2] = '\0';
  key_str[3] = '\0';
  key_str[4] = '\0';
  key_str[5] = '\0';
  key_str[6] = '\0';
  key_str[7] = '\0';
  key_str[8] = '\0';
  key_str[9] = '\0';
  key_str[10] = '\0';
  key_str[0xb] = '\0';
  key_str[0xc] = '\0';
  key_str[0xd] = '\0';
  key_str[0xe] = '\0';
  key_str[0xf] = '\0';
  key_str[0x10] = '\0';
  key_str[0x11] = '\0';
  key_str[0x12] = '\0';
  key_str[0x13] = '\0';
  key_str[0x14] = '\0';
  key_str[0x15] = '\0';
  key_str[0x16] = '\0';
  key_str[0x17] = '\0';
  key_str[0x18] = '\0';
  key_str[0x19] = '\0';
  key_str[0x1a] = '\0';
  key_str[0x1b] = '\0';
  key_str[0x1c] = '\0';
  key_str[0x1d] = '\0';
  key_str[0x1e] = '\0';
  key_str[0x1f] = '\0';
  for (; start_bit <= end_bit; start_bit = start_bit + iVar2) {
    iVar2 = start_bit + 7;
    if (-1 < start_bit) {
      iVar2 = start_bit;
    }
    iVar1 = iVar2 >> 3;
    if (end_bit - start_bit < 7) {
      uVar3 = (uint)(byte)(7 - ((char)start_bit - ((byte)iVar2 & 0xf8)));
      key_str[iVar1] = key_str[iVar1] | (byte)((key[iVar1] >> (uVar3 & 0x1f) & 1) << (uVar3 & 0x1f))
      ;
      iVar2 = 1;
    }
    else {
      key_str[iVar1] = key[iVar1];
      iVar2 = 8;
    }
  }
  iVar2 = tbl->lgn;
  iVar1 = iVar2 + 7;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  iVar1 = iVar1 >> 3;
  *(uint *)(key_str + iVar1) = tbl->tbl_id * tbl->h + row_no;
  if (iVar1 == -4) {
    uVar3 = 0x510f68cf;
  }
  else {
    uVar3 = 0x172a550d;
    lVar4 = 0;
    do {
      uVar3 = (uint)key_str[lVar4] + uVar3 * 0x172a554f;
      lVar4 = lVar4 + 1;
    } while (iVar1 + 4 != (int)lVar4);
    uVar3 = uVar3 ^ 0x46253dc2;
  }
  return uVar3 % (uint)tbl->w;
}

Assistant:

unsigned int LDSketch_find(LDSketch_t* tbl, const unsigned char* key,
	int start_bit, int end_bit, int row_no) {
	unsigned char key_str[50];  // assume n/8 + 4 <= 50
	unsigned int oper;
	char bit;
	unsigned int ret_bucket;

	int i;

	// set the key string
	memset(key_str, 0, sizeof(key_str));
	i = start_bit;  // start_bit == 0 in all cases
	while (i <= end_bit) {
		if (end_bit - i + 1 >= 8) {
			key_str[i / 8] = key[i / 8];
			i += 8;
		}
		else {
			bit = (key[i / 8] & (1 << (8 - ((i % 8) + 1)))) > 0 ? 1 : 0;
			key_str[i / 8] |= (bit << (8 - ((i % 8) + 1)));
			i++;
		}
	}

	// set the operator and add it to key string
	// oper = part_no * tbl->[part_no] + array_no;
	oper = tbl->h * tbl->tbl_id + row_no;
	// oper = row_no;
	memcpy(key_str + tbl->lgn / 8, &oper, sizeof(unsigned int));

	/*
	// hash
	MD5_CTX md5;
	unsigned char digest[16];
	MD5_Init(&md5);
	MD5_Update(&md5, key_str, tbl->n/8 + sizeof(unsigned int));
	MD5_Final(digest, &md5);
	memcpy(&ret_bucket, digest, sizeof(unsigned int));	// take 1st 4 bytes
	ret_bucket = (ret_bucket % tbl->K);
	*/

	ret_bucket =
		LD_AwareHash1(key_str, (unsigned int)(tbl->lgn / 8 + sizeof(unsigned int))) %
		(tbl->w);

	// return
	return ret_bucket;
}